

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O0

void duckdb::FSSTStorage::Compress(CompressionState *state_p,Vector *scan_vector,idx_t count)

{
  string_t uncompressed_string;
  bool bVar1;
  idx_t iVar2;
  undefined8 uVar3;
  reference ppuVar4;
  FSSTCompressionState *this;
  string *msg;
  FSSTCompressionState *this_00;
  reference ppuVar5;
  ulong in_RDX;
  idx_t idx_2;
  idx_t i_2;
  idx_t compressed_idx;
  size_t res;
  vector<unsigned_char,_true> compress_buffer;
  vector<unsigned_long,_true> sizes_out;
  vector<unsigned_char_*,_true> strings_out;
  size_t compress_buffer_size;
  idx_t idx_1;
  idx_t i_1;
  idx_t idx;
  idx_t i;
  idx_t total_count;
  size_t total_size;
  vector<unsigned_char_*,_true> strings_in;
  vector<unsigned_long,_true> sizes_in;
  string_t *data;
  UnifiedVectorFormat vdata;
  FSSTCompressionState *state;
  string *in_stack_fffffffffffffcd8;
  UnifiedVectorFormat *in_stack_fffffffffffffce0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffce8;
  FSSTCompressionState *in_stack_fffffffffffffcf0;
  u8 *in_stack_fffffffffffffcf8;
  size_t in_stack_fffffffffffffd00;
  u8 **in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  size_t in_stack_fffffffffffffd18;
  duckdb_fsst_encoder_t *in_stack_fffffffffffffd20;
  FSSTCompressionState *in_stack_fffffffffffffd30;
  string *compressed_string_len;
  uchar *compressed_string;
  duckdb_fsst_encoder_t *ppvVar6;
  UnifiedVectorFormat *in_stack_fffffffffffffda0;
  idx_t in_stack_fffffffffffffda8;
  Vector *in_stack_fffffffffffffdb0;
  ulong local_1d0;
  allocator local_1b9;
  string local_1b8 [32];
  FSSTCompressionState *local_198;
  undefined1 local_189;
  undefined8 local_168;
  undefined8 local_140;
  uchar *local_120;
  undefined4 local_118;
  undefined1 local_112;
  allocator local_111;
  string local_110 [32];
  idx_t local_f0;
  ulong local_e8;
  char *local_e0;
  idx_t local_d8;
  idx_t local_d0;
  ulong local_c8;
  FSSTCompressionState *local_c0;
  long local_b8;
  string_t *local_80;
  UnifiedVectorFormat local_68;
  FSSTCompressionState *local_20;
  ulong local_18;
  
  local_18 = in_RDX;
  local_20 = CompressionState::Cast<duckdb::FSSTCompressionState>
                       ((CompressionState *)in_stack_fffffffffffffce0);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffcf0);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  local_80 = UnifiedVectorFormat::GetData<duckdb::string_t>(&local_68);
  vector<unsigned_long,_true>::vector((vector<unsigned_long,_true> *)0xa1ffac);
  vector<unsigned_char_*,_true>::vector((vector<unsigned_char_*,_true> *)0xa1ffb9);
  local_b8 = 0;
  local_c0 = (FSSTCompressionState *)0x0;
  for (local_c8 = 0; local_c8 < local_18; local_c8 = local_c8 + 1) {
    local_d0 = SelectionVector::get_index(local_68.sel,local_c8);
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffce8,(idx_t)in_stack_fffffffffffffce0);
    if ((bVar1) && (iVar2 = string_t::GetSize(local_80 + local_d0), iVar2 != 0)) {
      local_c0 = (FSSTCompressionState *)
                 ((long)&(local_c0->super_CompressionState)._vptr_CompressionState + 1);
      iVar2 = string_t::GetSize(local_80 + local_d0);
      local_b8 = local_b8 + iVar2;
      local_d8 = string_t::GetSize(local_80 + local_d0);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffce0,
                 (value_type_conflict1 *)in_stack_fffffffffffffcd8);
      local_e0 = string_t::GetData((string_t *)in_stack_fffffffffffffce0);
      ::std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back
                ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                 in_stack_fffffffffffffce0,(value_type *)in_stack_fffffffffffffcd8);
    }
  }
  if (local_c0 == (FSSTCompressionState *)0x0) {
    for (local_e8 = 0; local_e8 < local_18; local_e8 = local_e8 + 1) {
      local_f0 = SelectionVector::get_index(local_68.sel,local_e8);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffce8,(idx_t)in_stack_fffffffffffffce0);
      if (bVar1) {
        iVar2 = string_t::GetSize(local_80 + local_f0);
        if (iVar2 != 0) {
          local_112 = 1;
          uVar3 = __cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_110,"FSST: no encoder found even though there are values to encode",
                     &local_111);
          FatalException::FatalException
                    ((FatalException *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
          local_112 = 0;
          __cxa_throw(uVar3,&FatalException::typeinfo,FatalException::~FatalException);
        }
        FSSTCompressionState::AddEmptyString(in_stack_fffffffffffffcf0);
      }
      else {
        FSSTCompressionState::AddNull(in_stack_fffffffffffffd30);
      }
    }
    local_118 = 1;
  }
  else {
    local_120 = (uchar *)MaxValue<unsigned_long>(local_b8 * 2 + 7,1);
    local_140 = 0;
    ::std::allocator<unsigned_char_*>::allocator((allocator<unsigned_char_*> *)0xa20425);
    vector<unsigned_char_*,_true>::vector
              ((vector<unsigned_char_*,_true> *)in_stack_fffffffffffffcf0,
               (size_type)in_stack_fffffffffffffce8,(value_type *)in_stack_fffffffffffffce0,
               (allocator_type *)in_stack_fffffffffffffcd8);
    ::std::allocator<unsigned_char_*>::~allocator((allocator<unsigned_char_*> *)0xa20459);
    local_168 = 0;
    ::std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xa2048a);
    vector<unsigned_long,_true>::vector
              ((vector<unsigned_long,_true> *)in_stack_fffffffffffffcf0,
               (size_type)in_stack_fffffffffffffce8,
               (value_type_conflict1 *)in_stack_fffffffffffffce0,
               (allocator_type *)in_stack_fffffffffffffcd8);
    ::std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xa204be);
    local_189 = 0;
    ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0xa204eb);
    vector<unsigned_char,_true>::vector
              ((vector<unsigned_char,_true> *)in_stack_fffffffffffffcf0,
               (size_type)in_stack_fffffffffffffce8,
               (value_type_conflict4 *)in_stack_fffffffffffffce0,
               (allocator_type *)in_stack_fffffffffffffcd8);
    ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0xa2051f);
    ppvVar6 = local_20->fsst_encoder;
    vector<unsigned_long,_true>::operator[]
              ((vector<unsigned_long,_true> *)in_stack_fffffffffffffce0,
               (size_type)in_stack_fffffffffffffcd8);
    ppuVar4 = vector<unsigned_char_*,_true>::operator[]
                        ((vector<unsigned_char_*,_true> *)in_stack_fffffffffffffce0,
                         (size_type)in_stack_fffffffffffffcd8);
    compressed_string = local_120;
    this = (FSSTCompressionState *)
           vector<unsigned_char,_true>::operator[]
                     ((vector<unsigned_char,_true> *)in_stack_fffffffffffffce0,
                      (size_type)in_stack_fffffffffffffcd8);
    msg = (string *)
          vector<unsigned_long,_true>::operator[]
                    ((vector<unsigned_long,_true> *)in_stack_fffffffffffffce0,
                     (size_type)in_stack_fffffffffffffcd8);
    in_stack_fffffffffffffce0 =
         (UnifiedVectorFormat *)
         vector<unsigned_char_*,_true>::operator[]
                   ((vector<unsigned_char_*,_true> *)in_stack_fffffffffffffce0,
                    (size_type)in_stack_fffffffffffffcd8);
    compressed_string_len = msg;
    this_00 = (FSSTCompressionState *)
              duckdb_fsst_compress
                        (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                         (size_t *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                         in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                         in_stack_fffffffffffffcf8,(size_t *)in_stack_fffffffffffffd30,
                         (u8 **)in_stack_fffffffffffffce0);
    local_198 = this_00;
    if (this_00 != local_c0) {
      uVar3 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_1b8,"FSST compression failed to compress all strings",&local_1b9);
      FatalException::FatalException((FatalException *)in_stack_fffffffffffffce0,msg);
      __cxa_throw(uVar3,&FatalException::typeinfo,FatalException::~FatalException);
    }
    for (local_1d0 = 0; local_1d0 < local_18; local_1d0 = local_1d0 + 1) {
      iVar2 = SelectionVector::get_index(local_68.sel,local_1d0);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffffce8,(idx_t)in_stack_fffffffffffffce0);
      if (bVar1) {
        iVar2 = string_t::GetSize(local_80 + iVar2);
        if (iVar2 == 0) {
          FSSTCompressionState::AddEmptyString(in_stack_fffffffffffffcf0);
        }
        else {
          ppuVar5 = vector<unsigned_char_*,_true>::operator[]
                              ((vector<unsigned_char_*,_true> *)in_stack_fffffffffffffce0,
                               (size_type)msg);
          in_stack_fffffffffffffce8 = (TemplatedValidityMask<unsigned_long> *)*ppuVar5;
          in_stack_fffffffffffffcf0 =
               (FSSTCompressionState *)
               vector<unsigned_long,_true>::operator[]
                         ((vector<unsigned_long,_true> *)in_stack_fffffffffffffce0,(size_type)msg);
          uncompressed_string.value.pointer.ptr = (char *)ppvVar6;
          uncompressed_string.value._0_8_ = ppuVar4;
          FSSTCompressionState::UpdateState
                    (this,uncompressed_string,compressed_string,(size_t)compressed_string_len);
        }
      }
      else {
        FSSTCompressionState::AddNull(this_00);
      }
    }
    vector<unsigned_char,_true>::~vector((vector<unsigned_char,_true> *)0xa20950);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xa2095d);
    vector<unsigned_char_*,_true>::~vector((vector<unsigned_char_*,_true> *)0xa2096a);
    local_118 = 0;
  }
  vector<unsigned_char_*,_true>::~vector((vector<unsigned_char_*,_true> *)0xa20982);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xa2098f);
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffce0);
  return;
}

Assistant:

void FSSTStorage::Compress(CompressionState &state_p, Vector &scan_vector, idx_t count) {
	auto &state = state_p.Cast<FSSTCompressionState>();

	// Get vector data
	UnifiedVectorFormat vdata;
	scan_vector.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);

	// Collect pointers to strings to compress
	vector<size_t> sizes_in;
	vector<unsigned char *> strings_in;
	size_t total_size = 0;
	idx_t total_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);

		// Note: we treat nulls and empty strings the same
		if (!vdata.validity.RowIsValid(idx) || data[idx].GetSize() == 0) {
			continue;
		}

		total_count++;
		total_size += data[idx].GetSize();
		sizes_in.push_back(data[idx].GetSize());
		strings_in.push_back((unsigned char *)data[idx].GetData()); // NOLINT
	}

	// Only Nulls or empty strings in this vector, nothing to compress
	if (total_count == 0) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = vdata.sel->get_index(i);
			if (!vdata.validity.RowIsValid(idx)) {
				state.AddNull();
			} else if (data[idx].GetSize() == 0) {
				state.AddEmptyString();
			} else {
				throw FatalException("FSST: no encoder found even though there are values to encode");
			}
		}
		return;
	}

	// Compress buffers
	size_t compress_buffer_size = MaxValue<size_t>(total_size * 2 + 7, 1);
	vector<unsigned char *> strings_out(total_count, nullptr);
	vector<size_t> sizes_out(total_count, 0);
	vector<unsigned char> compress_buffer(compress_buffer_size, 0);

	auto res = duckdb_fsst_compress(
	    state.fsst_encoder,   /* IN: encoder obtained from duckdb_fsst_create(). */
	    total_count,          /* IN: number of strings in batch to compress. */
	    &sizes_in[0],         /* IN: byte-lengths of the inputs */
	    &strings_in[0],       /* IN: input string start pointers. */
	    compress_buffer_size, /* IN: byte-length of output buffer. */
	    &compress_buffer[0],  /* OUT: memory buffer to put the compressed strings in (one after the other). */
	    &sizes_out[0],        /* OUT: byte-lengths of the compressed strings. */
	    &strings_out[0]       /* OUT: output string start pointers. Will all point into [output,output+size). */
	);

	if (res != total_count) {
		throw FatalException("FSST compression failed to compress all strings");
	}

	// Push the compressed strings to the compression state one by one
	idx_t compressed_idx = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!vdata.validity.RowIsValid(idx)) {
			state.AddNull();
		} else if (data[idx].GetSize() == 0) {
			state.AddEmptyString();
		} else {
			state.UpdateState(data[idx], strings_out[compressed_idx], sizes_out[compressed_idx]);
			compressed_idx++;
		}
	}
}